

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

void uv__epoll_ctl_prep(int epollfd,uv__iou *ctl,epoll_event (*events) [256],int op,int fd,
                       epoll_event *e)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  epoll_event *peVar5;
  undefined1 *__s;
  uint32_t slot;
  uint32_t mask;
  epoll_event *pe;
  uv__io_uring_sqe *sqe;
  epoll_event *e_local;
  int fd_local;
  int op_local;
  epoll_event (*events_local) [256];
  uv__iou *ctl_local;
  int epollfd_local;
  
  if (ctl->ringfd == -1) {
    iVar2 = epoll_ctl(epollfd,op,fd,(epoll_event *)e);
    if ((iVar2 != 0) && (op != 2)) {
      if (op != 1) {
        abort();
      }
      piVar4 = __errno_location();
      if (*piVar4 != 0x11) {
        abort();
      }
      iVar2 = epoll_ctl(epollfd,3,fd,(epoll_event *)e);
      if (iVar2 != 0) {
        abort();
      }
    }
  }
  else {
    uVar1 = ctl->sqmask;
    uVar3 = *ctl->sqtail;
    *ctl->sqtail = uVar3 + 1;
    uVar3 = uVar3 & uVar1;
    peVar5 = *events + uVar3;
    *(undefined8 *)peVar5 = *(undefined8 *)e;
    *(undefined4 *)((long)&peVar5->data + 4) = *(undefined4 *)((long)&e->data + 4);
    __s = (undefined1 *)((long)ctl->sqe + (ulong)uVar3 * 0x40);
    memset(__s,0,0x40);
    *(epoll_event **)(__s + 0x10) = peVar5;
    *(int *)(__s + 4) = epollfd;
    *(int *)(__s + 0x18) = op;
    *(long *)(__s + 8) = (long)fd;
    *__s = 0x1d;
    *(ulong *)(__s + 0x20) = CONCAT44(fd,op | uVar3 << 2);
    if ((*ctl->sqhead & uVar1) == (*ctl->sqtail & uVar1)) {
      uv__epoll_ctl_flush(epollfd,ctl,events);
    }
  }
  return;
}

Assistant:

static void uv__epoll_ctl_prep(int epollfd,
                               struct uv__iou* ctl,
                               struct epoll_event (*events)[256],
                               int op,
                               int fd,
                               struct epoll_event* e) {
  struct uv__io_uring_sqe* sqe;
  struct epoll_event* pe;
  uint32_t mask;
  uint32_t slot;

  if (ctl->ringfd == -1) {
    if (!epoll_ctl(epollfd, op, fd, e))
      return;

    if (op == EPOLL_CTL_DEL)
      return;  /* Ignore errors, may be racing with another thread. */

    if (op != EPOLL_CTL_ADD)
      abort();

    if (errno != EEXIST)
      abort();

    /* File descriptor that's been watched before, update event mask. */
    if (!epoll_ctl(epollfd, EPOLL_CTL_MOD, fd, e))
      return;

    abort();
  } else {
    mask = ctl->sqmask;
    slot = (*ctl->sqtail)++ & mask;

    pe = &(*events)[slot];
    *pe = *e;

    sqe = ctl->sqe;
    sqe = &sqe[slot];

    memset(sqe, 0, sizeof(*sqe));
    sqe->addr = (uintptr_t) pe;
    sqe->fd = epollfd;
    sqe->len = op;
    sqe->off = fd;
    sqe->opcode = UV__IORING_OP_EPOLL_CTL;
    sqe->user_data = op | slot << 2 | (int64_t) fd << 32;

    if ((*ctl->sqhead & mask) == (*ctl->sqtail & mask))
      uv__epoll_ctl_flush(epollfd, ctl, events);
  }
}